

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O2

bool __thiscall Shell::NewCNF::Occurrences::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  List<Shell::NewCNF::Occurrence> *pLVar2;
  uint uVar3;
  List<Shell::NewCNF::Occurrence> **ppLVar4;
  Occurrence *this_00;
  SmartPtr<Shell::NewCNF::GenClause> local_70;
  SmartPtr<Shell::NewCNF::Occurrence> *local_60;
  SmartPtr<Shell::NewCNF::Occurrence> local_58;
  Occurrence occ;
  
  local_60 = &this->_current;
  do {
    pLVar2 = (this->_iterator)._cur;
    if (pLVar2 == (List<Shell::NewCNF::Occurrence> *)0x0) {
      ppLVar4 = (this->_iterator)._lst;
    }
    else {
      ppLVar4 = &pLVar2->_tail;
    }
    pLVar2 = *ppLVar4;
    if (pLVar2 == (List<Shell::NewCNF::Occurrence> *)0x0) break;
    Lib::List<Shell::NewCNF::Occurrence>::DelIterator::next(&occ,&this->_iterator);
    bVar1 = (occ.gc._obj)->valid;
    if (bVar1 == false) {
      Lib::List<Shell::NewCNF::Occurrence>::DelIterator::del(&this->_iterator);
    }
    else {
      this_00 = (Occurrence *)Occurrence::operator_new(0x18);
      uVar3 = occ.position;
      local_70._obj = occ.gc._obj;
      local_70._refCnt = occ.gc._refCnt;
      if (occ.gc._refCnt != (RefCounter *)0x0 && occ.gc._obj != (GenClause *)0x0) {
        (occ.gc._refCnt)->_val = (occ.gc._refCnt)->_val + 1;
      }
      Lib::SmartPtr<Shell::NewCNF::GenClause>::SmartPtr
                ((SmartPtr<Shell::NewCNF::GenClause> *)this_00,&local_70);
      this_00->position = uVar3;
      local_58._obj = this_00;
      local_58._refCnt =
           (RefCounter *)Lib::SmartPtr<Shell::NewCNF::Occurrence>::RefCounter::operator_new(4);
      (local_58._refCnt)->_val = 1;
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::operator=(local_60,&local_58);
      Lib::SmartPtr<Shell::NewCNF::Occurrence>::~SmartPtr(&local_58);
      Lib::SmartPtr<Shell::NewCNF::GenClause>::~SmartPtr(&local_70);
    }
    Lib::SmartPtr<Shell::NewCNF::GenClause>::~SmartPtr(&occ.gc);
  } while (bVar1 == false);
  return pLVar2 != (List<Shell::NewCNF::Occurrence> *)0x0;
}

Assistant:

inline bool hasNext() {
        while (_iterator.hasNext()) {
          Occurrence occ = _iterator.next();
          if (!occ.gc->valid) {
            _iterator.del();
            continue;
          }
          _current = SmartPtr<Occurrence>(new Occurrence(occ.gc, occ.position));
          return true;
        }
        return false;
      }